

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

_Bool mi_bitmap_is_claimedx
                (mi_bitmap_t bitmap,size_t bitmap_fields,size_t count,mi_bitmap_index_t bitmap_idx,
                _Bool *any_ones)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  mi_bitmap_index_t in_RCX;
  size_t in_RDX;
  long in_RDI;
  long in_R8;
  size_t field;
  size_t mask;
  size_t bitidx;
  size_t idx;
  
  sVar2 = mi_bitmap_index_field(in_RCX);
  sVar3 = mi_bitmap_index_bit_in_field(in_RCX);
  sVar3 = mi_bitmap_mask_(in_RDX,sVar3);
  uVar1 = *(ulong *)(in_RDI + sVar2 * 8);
  if (in_R8 != 0) {
    *(bool *)in_R8 = (uVar1 & sVar3) != 0;
  }
  return (uVar1 & sVar3) == sVar3;
}

Assistant:

static bool mi_bitmap_is_claimedx(mi_bitmap_t bitmap, size_t bitmap_fields, size_t count, mi_bitmap_index_t bitmap_idx, bool* any_ones) {
  const size_t idx = mi_bitmap_index_field(bitmap_idx);
  const size_t bitidx = mi_bitmap_index_bit_in_field(bitmap_idx);
  const size_t mask = mi_bitmap_mask_(count, bitidx);
  mi_assert_internal(bitmap_fields > idx); MI_UNUSED(bitmap_fields);
  const size_t field = mi_atomic_load_relaxed(&bitmap[idx]);
  if (any_ones != NULL) { *any_ones = ((field & mask) != 0); }
  return ((field & mask) == mask);
}